

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::close_rle85(Fl_PostScript_Graphics_Driver *this,void *data)

{
  uchar local_21;
  undefined8 *puStack_20;
  uchar c;
  struct_rle85 *rle;
  void *data_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  puStack_20 = (undefined8 *)data;
  rle = (struct_rle85 *)data;
  data_local = this;
  if (*(int *)((long)data + 0x8c) < 1) {
    if (*(int *)((long)data + 0x88) != 0) {
      local_21 = (char)*(undefined4 *)((long)data + 0x88) + 0xff;
      write85(this,*data,&local_21,1);
      write85(this,(void *)*puStack_20,(uchar *)(puStack_20 + 1),*(int *)(puStack_20 + 0x11));
    }
  }
  else {
    local_21 = '\x01' - (char)*(undefined4 *)((long)data + 0x8c);
    write85(this,*data,&local_21,1);
    write85(this,(void *)*puStack_20,(uchar *)(puStack_20 + 1),1);
  }
  local_21 = 0x80;
  write85(this,(void *)*puStack_20,&local_21,1);
  close85(this,(void *)*puStack_20);
  if (puStack_20 != (undefined8 *)0x0) {
    operator_delete(puStack_20,0x90);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::close_rle85(void *data) // stop doing RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run, output it
    c = (uchar)(257 - rle->run_length);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, 1);
  } else if (rle->count) { // output the non-run buffer, if not empty
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1);
    write85(rle->data85, rle->buffer, rle->count);
  }
  c = (uchar)128;
  write85(rle->data85, &c, 1); // output EOD mark
  close85(rle->data85); // close ASCII85 encoding process
  delete rle;
}